

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ashared_ptr.h
# Opt level: O2

bool __thiscall
ashared_ptr<MapWrapper>::compare_exchange
          (ashared_ptr<MapWrapper> *this,ashared_ptr<MapWrapper> *expected,
          ashared_ptr<MapWrapper> *src)

{
  mutex *__mutex;
  bool bVar1;
  PtrWrapper<MapWrapper> *__p2;
  PtrWrapper<MapWrapper> *expected_ptr;
  
  expected_ptr = (expected->object)._M_b._M_p;
  __p2 = shareCurObject(src);
  __mutex = &this->lock;
  std::mutex::lock(__mutex);
  bVar1 = std::atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*>::compare_exchange_weak
                    (&this->object,&expected_ptr,__p2,memory_order_seq_cst);
  if (bVar1) {
    releaseObject(this,(expected->object)._M_b._M_p);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    operator=(expected,this);
    releaseObject(this,__p2);
  }
  return bVar1;
}

Assistant:

bool compare_exchange(ashared_ptr<T>& expected, ashared_ptr<T> src) {
        // Note: it is OK that `expected` becomes outdated.
        PtrWrapper<T>* expected_ptr = expected.object.load(MO);
        PtrWrapper<T>* val_ptr = src.shareCurObject();

        { // Lock for `object`
            std::lock_guard<std::mutex> l(lock);
            if (object.compare_exchange_weak(expected_ptr, val_ptr)) {
                // Succeeded.
                // Release old object.
                releaseObject(expected.object.load(MO));
                return true;
            }
        }
        // Failed.
        expected = *this;
        // Release the object from `src`.
        releaseObject(val_ptr);
        return false;
    }